

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O3

void __thiscall CMU462::DynamicScene::XFormWidget::drawHandles(XFormWidget *this)

{
  double *pdVar1;
  Mode MVar2;
  pointer pVVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 uVar18;
  undefined4 uVar19;
  double dVar20;
  double dVar21;
  undefined1 auStack_188 [16];
  double dStack_178;
  double dStack_170;
  undefined1 auStack_168 [16];
  undefined1 auStack_158 [16];
  double dStack_148;
  XFormWidget *pXStack_140;
  double dStack_138;
  double dStack_130;
  double dStack_128;
  undefined1 auStack_118 [16];
  double dStack_108;
  double dStack_100;
  undefined1 auStack_f8 [16];
  undefined1 auStack_e8 [16];
  undefined1 auStack_d8 [16];
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  double dStack_b8;
  double dStack_b0;
  undefined1 auStack_a8 [12];
  undefined4 uStack_9c;
  undefined1 auStack_98 [16];
  double dStack_88;
  double dStack_80;
  undefined1 auStack_78 [16];
  undefined1 auStack_68 [16];
  double dStack_58;
  undefined1 auStack_48 [16];
  double dStack_38;
  
  MVar2 = this->mode;
  if (MVar2 == Scale) {
    if ((this->target).object != (SceneObject *)0x0) {
      auStack_118._0_8_ = (this->center).x;
      auStack_118._8_8_ = (this->center).y;
      dStack_108 = (this->center).z;
      dVar21 = (this->bounds).max.x - (this->bounds).min.x;
      dVar5 = (this->bounds).max.y - (this->bounds).min.y;
      dVar20 = (this->bounds).max.z - (this->bounds).min.z;
      dVar21 = SQRT(dVar20 * dVar20 + dVar21 * dVar21 + dVar5 * dVar5) * 0.5;
      glLineWidth(0x41000000);
      glBegin(1);
      auStack_158._0_8_ = dVar21 * 0.9;
      auStack_158._8_8_ = 0;
      auStack_168._8_4_ = (int)auStack_158._0_8_;
      auStack_168._0_8_ = auStack_158._0_8_;
      auStack_168._12_4_ = (int)((ulong)auStack_158._0_8_ >> 0x20);
      lVar15 = 0;
      do {
        pVVar3 = (this->axes).
                 super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dStack_178 = *(double *)((long)&pVVar3->z + lVar15) * (double)auStack_158._0_8_ + dStack_108
        ;
        pdVar1 = (double *)((long)&pVVar3->x + lVar15);
        dVar5 = pdVar1[1] * (double)auStack_168._8_8_ + (double)auStack_118._8_8_;
        auStack_188._8_4_ = SUB84(dVar5,0);
        auStack_188._0_8_ = *pdVar1 * (double)auStack_168._0_8_ + (double)auStack_118._0_8_;
        auStack_188._12_4_ = (int)((ulong)dVar5 >> 0x20);
        glColor4ubv(*(undefined8 *)
                     ((long)&(((this->axisColors).
                               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data + lVar15));
        glVertex3dv(auStack_118);
        glVertex3dv(auStack_188);
        lVar15 = lVar15 + 0x18;
      } while (lVar15 != 0x48);
      glEnd();
      glBegin(7);
      auStack_158._0_8_ = dVar21 * 0.8;
      dVar21 = dVar21 * 0.5 * 0.2;
      auStack_158._8_8_ = 0;
      auStack_168._8_4_ = (int)auStack_158._0_8_;
      auStack_168._0_8_ = auStack_158._0_8_;
      auStack_168._12_4_ = (int)((ulong)auStack_158._0_8_ >> 0x20);
      auStack_78._8_4_ = SUB84(dVar21,0);
      auStack_78._0_8_ = dVar21;
      auStack_78._12_4_ = (int)((ulong)dVar21 >> 0x20);
      lVar15 = 0;
      pXStack_140 = this;
      do {
        glColor4ubv(*(undefined8 *)
                     ((long)&(((this->axisColors).
                               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data + lVar15));
        pVVar3 = (this->axes).
                 super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dStack_58 = *(double *)((long)&pVVar3->z + lVar15) * (double)auStack_158._0_8_ + dStack_108;
        pdVar1 = (double *)((long)&pVVar3->x + lVar15);
        dVar4 = *pdVar1 * (double)auStack_168._0_8_ + (double)auStack_118._0_8_;
        dVar6 = pdVar1[1] * (double)auStack_168._8_8_ + (double)auStack_118._8_8_;
        dVar7 = pVVar3[1].x;
        dVar8 = pVVar3[1].y;
        dVar5 = pVVar3[1].z;
        dVar9 = pVVar3[2].x;
        dVar10 = pVVar3[2].y;
        dVar20 = pVVar3[2].z;
        dStack_178 = ((pVVar3->z - dVar5) - dVar20) * dVar21 + dStack_58;
        auStack_188._8_8_ = ((pVVar3->y - dVar8) - dVar10) * (double)auStack_78._8_8_ + dVar6;
        auStack_188._0_8_ = ((pVVar3->x - dVar7) - dVar9) * (double)auStack_78._0_8_ + dVar4;
        dStack_88 = ((pVVar3->z - dVar5) + dVar20) * dVar21 + dStack_58;
        auStack_98._8_8_ = ((pVVar3->y - dVar8) + dVar10) * (double)auStack_78._8_8_ + dVar6;
        auStack_98._0_8_ = ((pVVar3->x - dVar7) + dVar9) * (double)auStack_78._0_8_ + dVar4;
        dStack_b8 = ((pVVar3->x + dVar7) - dVar9) * (double)auStack_78._0_8_ + dVar4;
        dStack_b0 = ((pVVar3->y + dVar8) - dVar10) * (double)auStack_78._8_8_ + dVar6;
        auStack_a8._0_8_ = ((pVVar3->z + dVar5) - dVar20) * dVar21 + dStack_58;
        dStack_128 = (pVVar3->z + dVar5 + dVar20) * dVar21 + dStack_58;
        dStack_138 = (pVVar3->x + dVar7 + dVar9) * (double)auStack_78._0_8_ + dVar4;
        dStack_130 = (pVVar3->y + dVar8 + dVar10) * (double)auStack_78._8_8_ + dVar6;
        uStack_c8 = ((-pVVar3->z - dVar5) - dVar20) * dVar21 + dStack_58;
        auStack_d8._8_8_ = ((-pVVar3->y - dVar8) - dVar10) * (double)auStack_78._8_8_ + dVar6;
        auStack_d8._0_8_ = ((-pVVar3->x - dVar7) - dVar9) * (double)auStack_78._0_8_ + dVar4;
        dStack_38 = ((-pVVar3->z - dVar5) + dVar20) * dVar21 + dStack_58;
        auStack_48._8_8_ = ((-pVVar3->y - dVar8) + dVar10) * (double)auStack_78._8_8_ + dVar6;
        auStack_48._0_8_ = ((-pVVar3->x - dVar7) + dVar9) * (double)auStack_78._0_8_ + dVar4;
        auStack_f8._8_8_ = ((dVar8 - pVVar3->y) - dVar10) * (double)auStack_78._8_8_ + dVar6;
        auStack_f8._0_8_ = ((dVar7 - pVVar3->x) - dVar9) * (double)auStack_78._0_8_ + dVar4;
        auStack_e8._0_8_ = ((dVar5 - pVVar3->z) - dVar20) * dVar21 + dStack_58;
        dStack_58 = ((dVar5 - pVVar3->z) + dVar20) * dVar21 + dStack_58;
        auStack_68._8_8_ = ((dVar8 - pVVar3->y) + dVar10) * (double)auStack_78._8_8_ + dVar6;
        auStack_68._0_8_ = ((dVar7 - pVVar3->x) + dVar9) * (double)auStack_78._0_8_ + dVar4;
        glVertex3dv(auStack_188);
        glVertex3dv(auStack_98);
        glVertex3dv(&dStack_138);
        glVertex3dv(&dStack_b8);
        glVertex3dv(auStack_d8);
        glVertex3dv(auStack_48);
        glVertex3dv(auStack_68);
        glVertex3dv(auStack_f8);
        glVertex3dv(auStack_188);
        glVertex3dv(&dStack_b8);
        glVertex3dv(auStack_f8);
        glVertex3dv(auStack_d8);
        glVertex3dv(auStack_98);
        glVertex3dv(&dStack_138);
        glVertex3dv(auStack_68);
        glVertex3dv(auStack_48);
        glVertex3dv(auStack_188);
        this = pXStack_140;
        glVertex3dv(auStack_d8);
        glVertex3dv(auStack_48);
        glVertex3dv(auStack_98);
        glVertex3dv(&dStack_b8);
        glVertex3dv(auStack_f8);
        glVertex3dv(auStack_68);
        glVertex3dv(&dStack_138);
        lVar15 = lVar15 + 0x18;
      } while (lVar15 != 0x48);
      glEnd();
      drawCenterHandle(this);
      glLineWidth(0x3f800000);
    }
    return;
  }
  if (MVar2 == Rotate) {
    if ((this->target).object != (SceneObject *)0x0) {
      auStack_98._0_8_ = (this->center).x;
      auStack_98._8_8_ = (this->center).y;
      dVar21 = (this->bounds).max.x - (this->bounds).min.x;
      dVar5 = (this->bounds).max.y - (this->bounds).min.y;
      auStack_f8._0_8_ = (this->center).z;
      dVar20 = (this->bounds).max.z - (this->bounds).min.z;
      uStack_c8 = SQRT(dVar20 * dVar20 + dVar21 * dVar21 + dVar5 * dVar5) * 0.5;
      uStack_c0 = 0;
      auStack_118._8_8_ = 0x173c52;
      glLineWidth(0x41000000);
      auStack_118._8_8_ = 0x173c5c;
      glBegin(1);
      auStack_a8._8_4_ = (undefined4)uStack_c8;
      auStack_a8._0_8_ = uStack_c8;
      uStack_9c = uStack_c8._4_4_;
      uVar17 = 0;
      do {
        uVar16 = uVar17 + 1;
        uVar13 = 0;
        if (uVar16 != 3) {
          uVar13 = uVar16 & 0xffffffff;
        }
        pVVar3 = (this->axes).
                 super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
                 super__Vector_impl_data._M_start;
        auStack_e8._0_8_ = pVVar3[uVar13].z;
        uVar14 = (ulong)((int)uVar17 - 1);
        if (uVar17 == 0) {
          uVar14 = 2;
        }
        auStack_78._0_8_ = pVVar3[uVar13].x;
        auStack_78._8_8_ = pVVar3[uVar13].y;
        dStack_88 = pVVar3[uVar14].x;
        dStack_80 = pVVar3[uVar14].y;
        auStack_f8._8_8_ = pVVar3[uVar14].z;
        auStack_118._8_8_ = 0x173cf8;
        glColor4ubv((this->axisColors).
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar17].
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
        dStack_b0 = 0.0;
        iVar12 = 1;
        do {
          dStack_b8 = dStack_b0 * 6.283185307179586 * 0.015625;
          dStack_b0 = dStack_b0 + 1.0;
          auStack_e8._8_8_ = (double)iVar12 * 6.283185307179586 * 0.015625;
          auStack_118._8_8_ = 0x173d4f;
          dStack_100 = cos(dStack_b8);
          auStack_d8._8_4_ = extraout_XMM0_Dc;
          auStack_d8._0_8_ = dStack_100;
          auStack_d8._12_4_ = extraout_XMM0_Dd;
          dStack_100 = (double)auStack_e8._0_8_ * dStack_100;
          auStack_118._8_8_ = 0x173d70;
          dVar21 = sin(dStack_b8);
          dStack_38 = (dStack_100 - (double)auStack_f8._8_8_ * dVar21) * uStack_c8 +
                      (double)auStack_f8._0_8_;
          dVar5 = ((double)auStack_d8._0_8_ * (double)auStack_78._8_8_ - dVar21 * dStack_80) *
                  stack0xffffffffffffff60 + (double)auStack_98._8_8_;
          auStack_48._8_4_ = SUB84(dVar5,0);
          auStack_48._0_8_ =
               ((double)auStack_d8._0_8_ * (double)auStack_78._0_8_ - dVar21 * dStack_88) *
               (double)auStack_a8._0_8_ + (double)auStack_98._0_8_;
          auStack_48._12_4_ = (int)((ulong)dVar5 >> 0x20);
          auStack_118._8_8_ = 0x173ddd;
          dStack_100 = cos((double)auStack_e8._8_8_);
          auStack_d8._8_4_ = extraout_XMM0_Dc_00;
          auStack_d8._0_8_ = dStack_100;
          auStack_d8._12_4_ = extraout_XMM0_Dd_00;
          dStack_100 = (double)auStack_e8._0_8_ * dStack_100;
          auStack_118._8_8_ = 0x173dfe;
          dVar21 = sin((double)auStack_e8._8_8_);
          dStack_58 = (dStack_100 - (double)auStack_f8._8_8_ * dVar21) * uStack_c8 +
                      (double)auStack_f8._0_8_;
          dVar5 = ((double)auStack_d8._0_8_ * (double)auStack_78._8_8_ - dVar21 * dStack_80) *
                  stack0xffffffffffffff60 + (double)auStack_98._8_8_;
          auStack_68._8_4_ = SUB84(dVar5,0);
          auStack_68._0_8_ =
               ((double)auStack_d8._0_8_ * (double)auStack_78._0_8_ - dVar21 * dStack_88) *
               (double)auStack_a8._0_8_ + (double)auStack_98._0_8_;
          auStack_68._12_4_ = (int)((ulong)dVar5 >> 0x20);
          auStack_118._8_8_ = 0x173e68;
          glVertex3dv(auStack_48);
          auStack_118._8_8_ = 0x173e70;
          glVertex3dv(auStack_68);
          iVar12 = iVar12 + 1;
        } while (iVar12 != 0x41);
        uVar17 = uVar16;
      } while (uVar16 != 3);
      auStack_118._8_8_ = 0x173e90;
      glEnd();
      auStack_118._8_8_ = 0x173e98;
      drawCenterHandle(this);
      auStack_118._8_8_ = 0x173ea5;
      glLineWidth(0x3f800000);
    }
    return;
  }
  if (MVar2 == Translate) {
    if ((this->target).object != (SceneObject *)0x0) {
      uVar11 = 0;
      if (this->transformedMode != false) {
        uVar11 = ((byte)~this->objectMode & 1) * 2;
      }
      dStack_138 = (this->center).x;
      dStack_130 = (this->center).y;
      dStack_128 = (this->center).z;
      dVar21 = (this->bounds).max.x - (this->bounds).min.x;
      auStack_188._8_8_ = auStack_188._0_8_;
      auStack_188._0_8_ = (this->bounds).max.y - (this->bounds).min.y;
      auStack_168._8_8_ = auStack_168._0_8_;
      auStack_168._0_8_ = (this->bounds).max.z - (this->bounds).min.z;
      glLineWidth(0x41000000);
      glBegin(1);
      if (uVar11 < 3) {
        uStack_c8 = SQRT((double)auStack_168._0_8_ * (double)auStack_168._0_8_ +
                         dVar21 * dVar21 + (double)auStack_188._0_8_ * (double)auStack_188._0_8_) *
                    0.5;
        uStack_c0 = 0;
        dStack_108 = uStack_c8 * 0.85;
        uVar17 = (ulong)uVar11;
        dStack_100 = 0.0;
        auStack_118._8_4_ = SUB84(dStack_108,0);
        auStack_118._0_8_ = dStack_108;
        auStack_118._12_4_ = (int)((ulong)dStack_108 >> 0x20);
        lVar15 = uVar17 * 0x18;
        auStack_188._8_4_ = uVar11;
        auStack_188._12_4_ = 0;
        do {
          uVar17 = uVar17 + 1;
          pVVar3 = (this->axes).
                   super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar1 = (double *)((long)&pVVar3->x + lVar15);
          dVar21 = pdVar1[1] * (double)auStack_118._8_8_ + dStack_130;
          auStack_e8._8_4_ = SUB84(dVar21,0);
          auStack_e8._0_8_ = *pdVar1 * (double)auStack_118._0_8_ + dStack_138;
          auStack_e8._12_4_ = (int)((ulong)dVar21 >> 0x20);
          auStack_d8._0_8_ = *(double *)((long)&pVVar3->z + lVar15) * dStack_108 + dStack_128;
          glColor4ubv(*(undefined8 *)
                       ((long)&(((this->axisColors).
                                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data + lVar15));
          glVertex3dv(&dStack_138);
          glVertex3dv(auStack_e8);
          lVar15 = lVar15 + 0x18;
        } while ((int)uVar17 != 3);
        glEnd();
        glBegin(4);
        if (uVar11 < 3) {
          dStack_88 = uStack_c8 * 0.5 * 0.15;
          dStack_80 = 0.0;
          auStack_98._8_4_ = SUB84(dStack_88,0);
          auStack_98._0_8_ = dStack_88;
          auStack_98._12_4_ = (int)((ulong)dStack_88 >> 0x20);
          auStack_a8._8_4_ = (undefined4)uStack_c8;
          auStack_a8._0_8_ = uStack_c8;
          uStack_9c = uStack_c8._4_4_;
          lVar15 = auStack_188._8_8_;
          do {
            pVVar3 = (this->axes).
                     super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl
                     .super__Vector_impl_data._M_start;
            auStack_e8._8_8_ = pVVar3[lVar15].y * stack0xffffffffffffff60 + dStack_130;
            auStack_e8._0_8_ = pVVar3[lVar15].x * (double)auStack_a8._0_8_ + dStack_138;
            auStack_d8._0_8_ = pVVar3[lVar15].z * uStack_c8 + dStack_128;
            dStack_148 = pVVar3[lVar15].z * dStack_108 + dStack_128;
            dVar21 = pVVar3[lVar15].y * (double)auStack_118._8_8_ + dStack_130;
            auStack_158._8_4_ = SUB84(dVar21,0);
            auStack_158._0_8_ = pVVar3[lVar15].x * (double)auStack_118._0_8_ + dStack_138;
            auStack_158._12_4_ = (int)((ulong)dVar21 >> 0x20);
            auStack_188._8_8_ = lVar15 + 1;
            uVar17 = auStack_188._8_8_ & 0xffffffff;
            if (auStack_188._8_8_ == 3) {
              uVar17 = 0;
            }
            auStack_188._0_8_ = pVVar3[uVar17].z * dStack_88;
            uVar13 = (ulong)((int)lVar15 - 1);
            if (lVar15 == 0) {
              uVar13 = 2;
            }
            auStack_168._8_8_ = pVVar3[uVar17].y * (double)auStack_98._8_8_;
            auStack_168._0_8_ = pVVar3[uVar17].x * (double)auStack_98._0_8_;
            dStack_b8 = pVVar3[uVar13].x * (double)auStack_98._0_8_;
            dStack_b0 = pVVar3[uVar13].y * (double)auStack_98._8_8_;
            dStack_170 = pVVar3[uVar13].z * dStack_88;
            glColor4ubv((this->axisColors).
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar15].
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
            uVar18 = 0;
            uVar19 = 0;
            iVar12 = 1;
            do {
              dVar21 = (double)CONCAT44(uVar19,uVar18) * 6.283185307179586 * 0.125;
              auStack_f8._0_8_ = dVar21;
              auStack_d8._8_8_ = (double)CONCAT44(uVar19,uVar18) + 1.0;
              dVar20 = (double)iVar12 * 6.283185307179586 * 0.125;
              dVar21 = cos(dVar21);
              dStack_178 = (double)auStack_188._0_8_ * dVar21 + dStack_148;
              dVar5 = dVar21 * (double)auStack_168._8_8_ + (double)auStack_158._8_8_;
              auStack_78._8_4_ = SUB84(dVar5,0);
              auStack_78._0_8_ = dVar21 * (double)auStack_168._0_8_ + (double)auStack_158._0_8_;
              auStack_78._12_4_ = (int)((ulong)dVar5 >> 0x20);
              dVar21 = sin((double)auStack_f8._0_8_);
              dStack_38 = dStack_178 - dStack_170 * dVar21;
              auStack_48._8_8_ = (double)auStack_78._8_8_ - dVar21 * dStack_b0;
              auStack_48._0_8_ = (double)auStack_78._0_8_ - dVar21 * dStack_b8;
              dVar21 = cos(dVar20);
              dStack_178 = (double)auStack_188._0_8_ * dVar21 + dStack_148;
              dVar5 = dVar21 * (double)auStack_168._8_8_ + (double)auStack_158._8_8_;
              auStack_f8._8_4_ = SUB84(dVar5,0);
              auStack_f8._0_8_ = dVar21 * (double)auStack_168._0_8_ + (double)auStack_158._0_8_;
              auStack_f8._12_4_ = (int)((ulong)dVar5 >> 0x20);
              dVar21 = sin(dVar20);
              dStack_58 = dStack_178 - dStack_170 * dVar21;
              auStack_68._8_8_ = (double)auStack_f8._8_8_ - dVar21 * dStack_b0;
              auStack_68._0_8_ = (double)auStack_f8._0_8_ - dVar21 * dStack_b8;
              glVertex3dv(auStack_e8);
              glVertex3dv(auStack_48);
              glVertex3dv(auStack_68);
              glVertex3dv(auStack_48);
              glVertex3dv(auStack_158);
              glVertex3dv(auStack_68);
              uVar18 = auStack_d8._8_4_;
              uVar19 = auStack_d8._12_4_;
              iVar12 = iVar12 + 1;
            } while (iVar12 != 9);
            lVar15 = auStack_188._8_8_;
          } while (auStack_188._8_8_ != 3);
        }
      }
      else {
        glEnd();
        glBegin(4);
      }
      glEnd();
      if ((this->transformedMode == false) || (this->objectMode == true)) {
        drawCenterHandle(this);
      }
      glLineWidth(0x3f800000);
    }
    return;
  }
  return;
}

Assistant:

void XFormWidget::drawHandles() const
{
   switch( mode )
   {
      case Mode::Translate:
         drawTranslateHandles();
         break;
      case Mode::Rotate:
         drawRotateHandles();
         break;
      case Mode::Scale:
         drawScaleHandles();
         break;
      default:
         break;
   }
}